

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O2

ChunkIterator * __thiscall absl::lts_20240722::Cord::ChunkIterator::operator++(ChunkIterator *this)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  anon_class_1_0_00000001 local_9;
  
  uVar2 = this->bytes_remaining_;
  if (uVar2 == 0) {
    operator++::anon_class_1_0_00000001::operator()(&local_9);
    uVar2 = this->bytes_remaining_;
  }
  uVar1 = (this->current_chunk_)._M_len;
  if (uVar1 <= uVar2) {
    this->bytes_remaining_ = uVar2 - uVar1;
    if (uVar2 - uVar1 != 0) {
      lVar3 = (long)(this->btree_reader_).navigator_.height_;
      if ((lVar3 < 0) || ((this->btree_reader_).navigator_.node_[lVar3] == (CordRepBtree *)0x0)) {
        if (uVar1 == 0) {
          __assert_fail("!current_chunk_.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/strings/cord.h"
                        ,0x621,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
        }
        (this->current_chunk_)._M_len = 0;
        (this->current_chunk_)._M_str = (char *)0x0;
      }
      else {
        this = AdvanceBtree(this);
      }
    }
    return this;
  }
  __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/strings/cord.h"
                ,0x61b,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
}

Assistant:

inline Cord::ChunkIterator& Cord::ChunkIterator::operator++() {
  ABSL_HARDENING_ASSERT(bytes_remaining_ > 0 &&
                        "Attempted to iterate past `end()`");
  assert(bytes_remaining_ >= current_chunk_.size());
  bytes_remaining_ -= current_chunk_.size();
  if (bytes_remaining_ > 0) {
    if (btree_reader_) {
      return AdvanceBtree();
    } else {
      assert(!current_chunk_.empty());  // Called on invalid iterator.
    }
    current_chunk_ = {};
  }
  return *this;
}